

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_buildFSETable_body_bmi2
               (ZSTD_seqSymbol *dt,short *normalizedCounter,uint maxSymbolValue,U32 *baseValue,
               U8 *nbAdditionalBits,uint tableLog,void *wksp,size_t wkspSize)

{
  short sVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  byte bVar9;
  long in_RCX;
  uint in_EDX;
  long in_RSI;
  undefined8 *in_RDI;
  long in_R8;
  uint in_R9D;
  undefined4 in_stack_00000008;
  U32 nextState;
  U32 symbol;
  U32 u_1;
  int n_1;
  int i_1;
  U32 position_1;
  U32 s_3;
  U32 step_1;
  U32 tableMask_1;
  size_t uPosition;
  size_t u;
  size_t unroll;
  size_t s_2;
  size_t position;
  int n;
  int i;
  U32 s_1;
  U64 sv;
  size_t pos;
  U64 add;
  size_t step;
  size_t tableMask;
  U32 s;
  S16 largeLimit;
  ZSTD_seqSymbol_header DTableH;
  U32 highThreshold;
  BYTE *spread;
  U16 *symbolNext;
  U32 tableSize;
  U32 maxSV1;
  ZSTD_seqSymbol *tableDecode;
  uint local_f4;
  int local_ec;
  uint local_e8;
  uint local_e4;
  ulong local_d0;
  ulong local_c0;
  ulong local_b8;
  int local_a8;
  uint local_a4;
  U64 local_a0;
  long local_98;
  uint local_74;
  undefined4 local_6c;
  uint local_64;
  
  lVar2 = CONCAT44(tableLog,in_stack_00000008);
  uVar3 = in_EDX + 1;
  bVar9 = (byte)in_R9D;
  uVar4 = 1 << (bVar9 & 0x1f);
  lVar7 = lVar2 + 0x6a;
  local_64 = uVar4 - 1;
  if (0x34 < in_EDX) {
    __assert_fail("maxSymbolValue <= MaxSeq",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xa655,
                  "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                 );
  }
  if (9 < in_R9D) {
    __assert_fail("tableLog <= MaxFSELog",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xa656,
                  "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                 );
  }
  if (nbAdditionalBits < (U8 *)0x272) {
    __assert_fail("wkspSize >= ZSTD_BUILD_FSE_TABLE_WKSP_SIZE",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xa657,
                  "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                 );
  }
  local_6c = 1;
  for (local_74 = 0; local_74 < uVar3; local_74 = local_74 + 1) {
    if (*(short *)(in_RSI + (ulong)local_74 * 2) == -1) {
      *(uint *)((long)in_RDI + (ulong)local_64 * 8 + 0xc) = local_74;
      *(undefined2 *)(lVar2 + (ulong)local_74 * 2) = 1;
      local_64 = local_64 - 1;
    }
    else {
      if ((short)(1 << (bVar9 - 1 & 0x1f)) <= *(short *)(in_RSI + (ulong)local_74 * 2)) {
        local_6c = 0;
      }
      if (*(short *)(in_RSI + (ulong)local_74 * 2) < 0) {
        __assert_fail("normalizedCounter[s]>=0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xa665,
                      "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                     );
      }
      *(undefined2 *)(lVar2 + (ulong)local_74 * 2) = *(undefined2 *)(in_RSI + (ulong)local_74 * 2);
    }
  }
  *in_RDI = CONCAT44(in_R9D,local_6c);
  if (0x200 < uVar4) {
    __assert_fail("tableSize <= 512",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xa66c,
                  "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                 );
  }
  if (local_64 == uVar4 - 1) {
    uVar8 = (ulong)((uVar4 >> 1) + (uVar4 >> 3) + 3);
    local_98 = 0;
    local_a0 = 0;
    for (local_a4 = 0; local_a4 < uVar3; local_a4 = local_a4 + 1) {
      iVar5 = (int)*(short *)(in_RSI + (ulong)local_a4 * 2);
      MEM_write64((void *)(lVar7 + local_98),local_a0);
      for (local_a8 = 8; local_a8 < iVar5; local_a8 = local_a8 + 8) {
        MEM_write64((void *)(lVar7 + local_98 + (long)local_a8),local_a0);
      }
      if (iVar5 < 0) {
        __assert_fail("n>=0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xa687,
                      "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                     );
      }
      local_98 = iVar5 + local_98;
      local_a0 = local_a0 + 0x101010101010101;
    }
    local_b8 = 0;
    if ((uVar4 & 1) != 0) {
      __assert_fail("tableSize % unroll == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa695,
                    "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                   );
    }
    for (local_c0 = 0; local_c0 < uVar4; local_c0 = local_c0 + 2) {
      for (local_d0 = 0; local_d0 < 2; local_d0 = local_d0 + 1) {
        *(uint *)((long)in_RDI + (local_b8 + local_d0 * uVar8 & (ulong)(uVar4 - 1)) * 8 + 0xc) =
             (uint)*(byte *)(lVar7 + local_c0 + local_d0);
      }
      local_b8 = local_b8 + uVar8 * 2 & (ulong)(uVar4 - 1);
    }
    if (local_b8 != 0) {
      __assert_fail("position == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa69e,
                    "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                   );
    }
  }
  else {
    local_e8 = 0;
    for (local_e4 = 0; local_e4 < uVar3; local_e4 = local_e4 + 1) {
      sVar1 = *(short *)(in_RSI + (ulong)local_e4 * 2);
      for (local_ec = 0; local_ec < sVar1; local_ec = local_ec + 1) {
        *(uint *)((long)in_RDI + (ulong)local_e8 * 8 + 0xc) = local_e4;
        do {
          local_e8 = local_e8 + (uVar4 >> 1) + (uVar4 >> 3) + 3 & uVar4 - 1;
        } while (local_64 < local_e8);
      }
    }
    if (local_e8 != 0) {
      __assert_fail("position == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa6ac,
                    "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                   );
    }
  }
  local_f4 = 0;
  while( true ) {
    if (uVar4 <= local_f4) {
      return;
    }
    uVar3 = *(uint *)((long)in_RDI + (ulong)local_f4 * 8 + 0xc);
    sVar1 = *(short *)(lVar2 + (ulong)uVar3 * 2);
    *(short *)(lVar2 + (ulong)uVar3 * 2) = sVar1 + 1;
    uVar6 = ZSTD_highbit32(0);
    *(byte *)((long)in_RDI + (ulong)local_f4 * 8 + 0xb) = bVar9 - (char)uVar6;
    *(short *)(in_RDI + (ulong)local_f4 + 1) =
         (sVar1 << (*(byte *)((long)in_RDI + (ulong)local_f4 * 8 + 0xb) & 0x1f)) - (short)uVar4;
    if (0xfe < *(byte *)(in_R8 + (ulong)uVar3)) break;
    *(undefined1 *)((long)in_RDI + (ulong)local_f4 * 8 + 10) = *(undefined1 *)(in_R8 + (ulong)uVar3)
    ;
    *(undefined4 *)((long)in_RDI + (ulong)local_f4 * 8 + 0xc) =
         *(undefined4 *)(in_RCX + (ulong)uVar3 * 4);
    local_f4 = local_f4 + 1;
  }
  __assert_fail("nbAdditionalBits[symbol] < 255",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0xa6b7,
                "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
               );
}

Assistant:

BMI2_TARGET_ATTRIBUTE static void ZSTD_buildFSETable_body_bmi2(ZSTD_seqSymbol* dt,
            const short* normalizedCounter, unsigned maxSymbolValue,
            const U32* baseValue, const U8* nbAdditionalBits,
            unsigned tableLog, void* wksp, size_t wkspSize)
{
    ZSTD_buildFSETable_body(dt, normalizedCounter, maxSymbolValue,
            baseValue, nbAdditionalBits, tableLog, wksp, wkspSize);
}